

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O0

ma_result ma_lpf_get_heap_layout(ma_lpf_config *pConfig,ma_lpf_heap_layout *pHeapLayout)

{
  ma_result mVar1;
  undefined1 local_98 [8];
  ma_lpf2_config lpf2Config;
  size_t lpf2HeapSizeInBytes;
  ma_lpf1_config lpf1Config;
  size_t lpf1HeapSizeInBytes;
  uint local_40;
  ma_uint32 ilpf2;
  ma_uint32 ilpf1;
  ma_uint32 lpf2Count;
  ma_uint32 lpf1Count;
  ma_result result;
  ma_lpf_heap_layout *pHeapLayout_local;
  ma_lpf_config *pConfig_local;
  undefined8 local_18;
  ma_lpf_heap_layout *local_10;
  
  _lpf1Count = pHeapLayout;
  pHeapLayout_local = (ma_lpf_heap_layout *)pConfig;
  if (pHeapLayout == (ma_lpf_heap_layout *)0x0) {
    __assert_fail("pHeapLayout != ((void*)0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/vendored/miniaudio/miniaudio.c"
                  ,0x83b5,
                  "ma_result ma_lpf_get_heap_layout(const ma_lpf_config *, ma_lpf_heap_layout *)");
  }
  local_18 = 0x18;
  local_10 = pHeapLayout;
  memset(pHeapLayout,0,0x18);
  if (pHeapLayout_local == (ma_lpf_heap_layout *)0x0) {
    pConfig_local._4_4_ = MA_INVALID_ARGS;
  }
  else if (*(int *)((long)&pHeapLayout_local->sizeInBytes + 4) == 0) {
    pConfig_local._4_4_ = MA_INVALID_ARGS;
  }
  else if ((uint)pHeapLayout_local[1].sizeInBytes < 9) {
    ma_lpf_calculate_sub_lpf_counts((ma_uint32)pHeapLayout_local[1].sizeInBytes,&ilpf1,&ilpf2);
    _lpf1Count->sizeInBytes = 0;
    _lpf1Count->lpf1Offset = _lpf1Count->sizeInBytes;
    for (local_40 = 0; local_40 < ilpf1; local_40 = local_40 + 1) {
      ma_lpf1_config_init((ma_lpf1_config *)&lpf2HeapSizeInBytes,
                          (ma_format)pHeapLayout_local->sizeInBytes,
                          *(ma_uint32 *)((long)&pHeapLayout_local->sizeInBytes + 4),
                          (ma_uint32)pHeapLayout_local->lpf1Offset,
                          (double)pHeapLayout_local->lpf2Offset);
      mVar1 = ma_lpf1_get_heap_size((ma_lpf1_config *)&lpf2HeapSizeInBytes,(size_t *)&lpf1Config.q);
      if (mVar1 != MA_SUCCESS) {
        return mVar1;
      }
      _lpf1Count->sizeInBytes = (long)lpf1Config.q + 0x28 + _lpf1Count->sizeInBytes;
      lpf2Count = 0;
    }
    _lpf1Count->lpf2Offset = _lpf1Count->sizeInBytes;
    for (lpf1HeapSizeInBytes._4_4_ = 0; lpf1HeapSizeInBytes._4_4_ < ilpf2;
        lpf1HeapSizeInBytes._4_4_ = lpf1HeapSizeInBytes._4_4_ + 1) {
      ma_lpf2_config_init((ma_lpf2_config *)local_98,(ma_format)pHeapLayout_local->sizeInBytes,
                          *(ma_uint32 *)((long)&pHeapLayout_local->sizeInBytes + 4),
                          (ma_uint32)pHeapLayout_local->lpf1Offset,
                          (double)pHeapLayout_local->lpf2Offset,0.707107);
      mVar1 = ma_lpf2_get_heap_size((ma_lpf2_config *)local_98,(size_t *)&lpf2Config.q);
      if (mVar1 != MA_SUCCESS) {
        return mVar1;
      }
      _lpf1Count->sizeInBytes = (long)lpf2Config.q + 0x40 + _lpf1Count->sizeInBytes;
      lpf2Count = 0;
    }
    _lpf1Count->sizeInBytes = _lpf1Count->sizeInBytes + 7 & 0xfffffffffffffff8;
    pConfig_local._4_4_ = MA_SUCCESS;
  }
  else {
    pConfig_local._4_4_ = MA_INVALID_ARGS;
  }
  return pConfig_local._4_4_;
}

Assistant:

static ma_result ma_lpf_get_heap_layout(const ma_lpf_config* pConfig, ma_lpf_heap_layout* pHeapLayout)
{
    ma_result result;
    ma_uint32 lpf1Count;
    ma_uint32 lpf2Count;
    ma_uint32 ilpf1;
    ma_uint32 ilpf2;

    MA_ASSERT(pHeapLayout != NULL);

    MA_ZERO_OBJECT(pHeapLayout);

    if (pConfig == NULL) {
        return MA_INVALID_ARGS;
    }

    if (pConfig->channels == 0) {
        return MA_INVALID_ARGS;
    }

    if (pConfig->order > MA_MAX_FILTER_ORDER) {
        return MA_INVALID_ARGS;
    }

    ma_lpf_calculate_sub_lpf_counts(pConfig->order, &lpf1Count, &lpf2Count);

    pHeapLayout->sizeInBytes = 0;

    /* LPF 1 */
    pHeapLayout->lpf1Offset = pHeapLayout->sizeInBytes;
    for (ilpf1 = 0; ilpf1 < lpf1Count; ilpf1 += 1) {
        size_t lpf1HeapSizeInBytes;
        ma_lpf1_config lpf1Config = ma_lpf1_config_init(pConfig->format, pConfig->channels, pConfig->sampleRate, pConfig->cutoffFrequency);

        result = ma_lpf1_get_heap_size(&lpf1Config, &lpf1HeapSizeInBytes);
        if (result != MA_SUCCESS) {
            return result;
        }

        pHeapLayout->sizeInBytes += sizeof(ma_lpf1) + lpf1HeapSizeInBytes;
    }

    /* LPF 2*/
    pHeapLayout->lpf2Offset = pHeapLayout->sizeInBytes;
    for (ilpf2 = 0; ilpf2 < lpf2Count; ilpf2 += 1) {
        size_t lpf2HeapSizeInBytes;
        ma_lpf2_config lpf2Config = ma_lpf2_config_init(pConfig->format, pConfig->channels, pConfig->sampleRate, pConfig->cutoffFrequency, 0.707107);   /* <-- The "q" parameter does not matter for the purpose of calculating the heap size. */

        result = ma_lpf2_get_heap_size(&lpf2Config, &lpf2HeapSizeInBytes);
        if (result != MA_SUCCESS) {
            return result;
        }

        pHeapLayout->sizeInBytes += sizeof(ma_lpf2) + lpf2HeapSizeInBytes;
    }

    /* Make sure allocation size is aligned. */
    pHeapLayout->sizeInBytes = ma_align_64(pHeapLayout->sizeInBytes);

    return MA_SUCCESS;
}